

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * valueAsString<bool>(string *__return_storage_ptr__,bool value)

{
  char *__s;
  undefined7 in_register_00000031;
  allocator<char> local_9;
  
  __s = "FALSE";
  if ((int)CONCAT71(in_register_00000031,value) != 0) {
    __s = "TRUE";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string valueAsString<bool>(bool value)
{
  return value ? "TRUE" : "FALSE";
}